

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O1

void __thiscall cpprofiler::Connector::sendNode(Connector *this,Node *node)

{
  int32_t iVar1;
  undefined8 uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  NodeStatus NVar8;
  
  if (this->_connected == true) {
    iVar3 = (node->node_).nid;
    iVar4 = (node->node_).rid;
    iVar1 = (node->node_).tid;
    iVar5 = (node->parent_).nid;
    iVar6 = (node->parent_).rid;
    (this->marshalling).msg._have_label = false;
    (this->marshalling).msg._have_nogood = false;
    (this->marshalling).msg._have_info = false;
    (this->marshalling).msg._have_version = false;
    (this->marshalling).msg._type = NODE;
    uVar2 = *(undefined8 *)&(node->parent_).tid;
    iVar7 = node->kids_;
    NVar8 = node->status_;
    (this->marshalling).msg._node.nid = iVar3;
    (this->marshalling).msg._node.rid = iVar4;
    (this->marshalling).msg._node.tid = iVar1;
    (this->marshalling).msg._parent.nid = iVar5;
    (this->marshalling).msg._parent.rid = iVar6;
    *(undefined8 *)&(this->marshalling).msg._parent.tid = uVar2;
    (this->marshalling).msg._kids = iVar7;
    (this->marshalling).msg._status = NVar8;
    if ((node->label_).present == true) {
      (this->marshalling).msg._have_label = true;
      std::__cxx11::string::_M_assign((string *)&(this->marshalling).msg._label);
    }
    if ((node->nogood_).present == true) {
      (this->marshalling).msg._have_nogood = true;
      std::__cxx11::string::_M_assign((string *)&(this->marshalling).msg._nogood);
    }
    if ((node->info_).present == true) {
      (this->marshalling).msg._have_info = true;
      std::__cxx11::string::_M_assign((string *)&(this->marshalling).msg._info);
    }
    sendOverSocket(this);
    return;
  }
  return;
}

Assistant:

void sendNode(const Node& node) {
    if (!_connected) return;

    auto& msg = marshalling.makeNode(node.nodeUID(), node.parentUID(),
                                     node.alt(), node.kids(), node.status());

    if (node.label().valid()) msg.set_label(node.label().value());
    if (node.nogood().valid()) msg.set_nogood(node.nogood().value());
    if (node.info().valid()) msg.set_info(node.info().value());

    sendOverSocket();
  }